

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O0

size_t sets_union<448ul,std::array<unsigned_long,4ul>>
                 (vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> *binary_sets,
                 array<unsigned_long,_4UL> *c)

{
  const_reference pvVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t sVar4;
  ulong local_58;
  size_t i;
  value_type x;
  array<unsigned_long,_4UL> *c_local;
  vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> *binary_sets_local;
  
  x.super__Base_bitset<7UL>._M_w[6] = (_WordT)c;
  pvVar1 = std::array<unsigned_long,_4UL>::operator[](c,0);
  pvVar2 = std::vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>::operator[]
                     (binary_sets,*pvVar1);
  memcpy(&i,pvVar2,0x38);
  local_58 = 1;
  while( true ) {
    sVar3 = std::array<unsigned_long,_4UL>::size
                      ((array<unsigned_long,_4UL> *)x.super__Base_bitset<7UL>._M_w[6]);
    if (sVar3 <= local_58) break;
    pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)x.super__Base_bitset<7UL>._M_w[6],local_58);
    pvVar2 = std::vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>::operator[]
                       (binary_sets,*pvVar1);
    std::bitset<448UL>::operator|=((bitset<448UL> *)&i,pvVar2);
    local_58 = local_58 + 1;
  }
  sVar4 = std::bitset<448UL>::count((bitset<448UL> *)&i);
  return sVar4;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}